

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_0,_13,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vec4 *local_100;
  ulong local_f8;
  float local_f0 [6];
  float local_d8 [4];
  float local_c8 [6];
  float local_b0 [3];
  float local_a4 [3];
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[0] = 0.0;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[0].m_data[3] = 0.0;
  puVar2 = &s_constInMat4;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  tcu::operator-(&local_98,&local_58,(evalCtx->coords).m_data[0]);
  local_a4[0] = local_98.m_data.m_data[0].m_data[0];
  local_a4[1] = local_98.m_data.m_data[0].m_data[1];
  local_a4[2] = local_98.m_data.m_data[0].m_data[2];
  local_b0[0] = local_98.m_data.m_data[1].m_data[1];
  local_b0[1] = local_98.m_data.m_data[1].m_data[2];
  local_b0[2] = local_98.m_data.m_data[1].m_data[3];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar3 = 0;
  do {
    local_d8[lVar3] = local_c8[lVar3 + 9] + local_c8[lVar3 + 6];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c8[3] = local_98.m_data.m_data[2].m_data[2];
  local_c8[4] = local_98.m_data.m_data[2].m_data[3];
  local_c8[5] = local_98.m_data.m_data[2].m_data[0];
  local_100 = (Vec4 *)0x0;
  local_f8 = local_f8 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_100 + lVar3 * 4) = local_d8[lVar3] + local_c8[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c8[0] = local_98.m_data.m_data[3].m_data[3];
  local_c8[1] = local_98.m_data.m_data[3].m_data[0];
  local_c8[2] = local_98.m_data.m_data[3].m_data[1];
  local_f0[2] = 0.0;
  local_f0[3] = 0.0;
  local_f0[4] = 0.0;
  lVar3 = 0;
  do {
    local_f0[lVar3 + 2] = *(float *)((long)&local_100 + lVar3 * 4) + local_c8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_100 = &evalCtx->color;
  local_f8 = 0x100000000;
  local_f0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_100 + lVar3 * 4)] = local_f0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}